

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O3

ssize_t __thiscall
MTCompositedBupOutputter::write(MTCompositedBupOutputter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  Size *pSVar2;
  Image local_60;
  path local_40;
  
  pSVar2 = (Size *)CONCAT44(in_register_00000034,__fd);
  local_60.size = *pSVar2;
  local_60.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)(pSVar2 + 1);
  local_60.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_finish = *(pointer *)(pSVar2 + 2);
  local_60.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)(pSVar2 + 3);
  pSVar2[1].width = 0;
  pSVar2[1].height = 0;
  pSVar2[2].width = 0;
  pSVar2[2].height = 0;
  pSVar2[3].width = 0;
  pSVar2[3].height = 0;
  std::filesystem::__cxx11::path::path(&local_40,(path *)__buf);
  ThreadedImageSaver::enqueue(&this->writer,&local_60,&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  sVar1 = extraout_RAX;
  if ((Size)local_60.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
            super__Vector_impl_data._M_start != (Size)0x0) {
    operator_delete(local_60.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    sVar1 = extraout_RAX_00;
  }
  return sVar1;
}

Assistant:

void write(Image& img, fs::path path) override {
		writer.enqueue(std::move(img), std::move(path));
	}